

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerator.cxx
# Opt level: O0

bool __thiscall
cmQtAutoGenerator::Run
          (cmQtAutoGenerator *this,string_view infoFile,string_view config,
          string_view executableConfig)

{
  GenT GVar1;
  bool bVar2;
  bool bVar3;
  byte bVar4;
  bool bVar5;
  _Ios_Openmode _Var6;
  uint uVar7;
  int iVar8;
  char *pcVar9;
  Logger *pLVar10;
  cmQtAutoGenerator *pcVar11;
  undefined1 auVar12 [16];
  string_view text;
  string_view text_00;
  string_view text_01;
  byte local_5a2;
  allocator<char> local_519;
  string local_518;
  byte local_4f3;
  byte local_4f2;
  allocator<char> local_4f1;
  string local_4f0;
  byte local_4cb;
  byte local_4ca;
  allocator<char> local_4c9;
  string local_4c8;
  byte local_4a3;
  byte local_4a2;
  allocator<char> local_4a1;
  string local_4a0;
  allocator<char> local_479;
  string local_478;
  uint local_454;
  undefined1 auStack_450 [4];
  uint verbosity;
  undefined8 local_448;
  string local_440;
  string local_420;
  string_view local_400;
  int local_3ec;
  undefined1 local_3e8 [16];
  string local_3d8;
  string local_3b8;
  string_view local_398;
  undefined1 local_388 [8];
  ifstream ifs;
  undefined1 local_180 [8];
  InfoT info;
  string local_140;
  string local_120;
  string local_100;
  string local_e0;
  allocator<char> local_b9;
  string local_b8 [39];
  allocator<char> local_91;
  string local_90 [55];
  allocator<char> local_59;
  string local_58 [32];
  cmQtAutoGenerator *local_38;
  cmQtAutoGenerator *this_local;
  string_view config_local;
  string_view infoFile_local;
  
  config_local._M_len = (size_t)config._M_str;
  pcVar11 = (cmQtAutoGenerator *)config._M_len;
  config_local._M_str = (char *)infoFile._M_len;
  local_38 = this;
  this_local = pcVar11;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (local_58,(basic_string_view<char,_std::char_traits<char>_> *)&this_local,&local_59);
  std::__cxx11::string::operator=((string *)&this->InfoConfig_,local_58);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator(&local_59);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (local_90,&executableConfig,&local_91);
  std::__cxx11::string::operator=((string *)&this->ExecutableConfig_,local_90);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator(&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (local_b8,(basic_string_view<char,_std::char_traits<char>_> *)&config_local._M_str,
             &local_b9);
  std::__cxx11::string::operator=((string *)&this->InfoFile_,local_b8);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator(&local_b9);
  cmsys::SystemTools::CollapseFullPath(&local_e0,&this->InfoFile_);
  std::__cxx11::string::~string((string *)&local_e0);
  cmsys::SystemTools::GetFilenamePath(&local_100,&this->InfoFile_);
  std::__cxx11::string::operator=((string *)&this->InfoDir_,(string *)&local_100);
  std::__cxx11::string::~string((string *)&local_100);
  bVar3 = cmFileTime::Load(&this->InfoFileTime_,&this->InfoFile_);
  if (bVar3) {
    InfoT::InfoT((InfoT *)local_180,this);
    pcVar9 = (char *)std::__cxx11::string::c_str();
    _Var6 = std::operator|(_S_in,_S_bin);
    std::ifstream::ifstream(local_388,pcVar9,_Var6);
    bVar4 = std::ios::operator!((ios *)(local_388 + (long)*(_func_int **)((long)local_388 + -0x18)))
    ;
    if ((bVar4 & 1) == 0) {
      bVar3 = InfoT::Read((InfoT *)local_180,(istream *)local_388);
      if (bVar3) {
        local_3ec = 0;
      }
      else {
        pLVar10 = Log(this);
        GVar1 = this->GenType_;
        _auStack_450 = std::__cxx11::string::operator_cast_to_basic_string_view
                                 ((string *)&this->InfoFile_);
        text_01._M_len = auStack_450._8_8_;
        text_01._M_str = (char *)pcVar11;
        cmQtAutoGen::Quoted_abi_cxx11_(&local_440,auStack_450._0_8_,text_01);
        cmStrCat<char_const(&)[26],std::__cxx11::string>
                  (&local_420,(char (*) [26])"Could not read info file ",&local_440);
        local_400 = (string_view)
                    std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_420);
        Logger::Error(pLVar10,GVar1,local_400);
        std::__cxx11::string::~string((string *)&local_420);
        std::__cxx11::string::~string((string *)&local_440);
        infoFile_local._M_str._7_1_ = 0;
        local_3ec = 1;
      }
    }
    else {
      pLVar10 = Log(this);
      GVar1 = this->GenType_;
      local_3e8 = std::__cxx11::string::operator_cast_to_basic_string_view
                            ((string *)&this->InfoFile_);
      text_00._M_len = local_3e8._8_8_;
      text_00._M_str = (char *)pcVar11;
      cmQtAutoGen::Quoted_abi_cxx11_(&local_3d8,local_3e8._0_8_,text_00);
      cmStrCat<char_const(&)[29],std::__cxx11::string>
                (&local_3b8,(char (*) [29])"Could not to open info file ",&local_3d8);
      local_398 = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_3b8);
      Logger::Error(pLVar10,GVar1,local_398);
      std::__cxx11::string::~string((string *)&local_3b8);
      std::__cxx11::string::~string((string *)&local_3d8);
      infoFile_local._M_str._7_1_ = 0;
      local_3ec = 1;
    }
    std::ifstream::~ifstream(local_388);
    if (local_3ec == 0) {
      local_454 = 0;
      std::allocator<char>::allocator();
      local_4a2 = 0;
      local_4a3 = 0;
      local_4ca = 0;
      local_4cb = 0;
      local_4f2 = 0;
      local_4f3 = 0;
      bVar2 = false;
      bVar3 = false;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_478,"VERBOSITY",&local_479);
      bVar5 = InfoT::GetUInt((InfoT *)local_180,&local_478,&local_454,false);
      local_5a2 = 1;
      if (bVar5) {
        std::allocator<char>::allocator();
        local_4a2 = 1;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_4a0,"CMAKE_SOURCE_DIR",&local_4a1);
        local_4a3 = 1;
        bVar5 = InfoT::GetString((InfoT *)local_180,&local_4a0,&(this->ProjectDirs_).Source,true);
        local_5a2 = 1;
        if (bVar5) {
          std::allocator<char>::allocator();
          local_4ca = 1;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_4c8,"CMAKE_BINARY_DIR",&local_4c9);
          local_4cb = 1;
          bVar5 = InfoT::GetString((InfoT *)local_180,&local_4c8,&(this->ProjectDirs_).Binary,true);
          local_5a2 = 1;
          if (bVar5) {
            std::allocator<char>::allocator();
            local_4f2 = 1;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_4f0,"CMAKE_CURRENT_SOURCE_DIR",&local_4f1);
            local_4f3 = 1;
            bVar5 = InfoT::GetString((InfoT *)local_180,&local_4f0,
                                     &(this->ProjectDirs_).CurrentSource,true);
            local_5a2 = 1;
            if (bVar5) {
              std::allocator<char>::allocator();
              bVar2 = true;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_518,"CMAKE_CURRENT_BINARY_DIR",&local_519);
              bVar3 = true;
              bVar5 = InfoT::GetString((InfoT *)local_180,&local_518,
                                       &(this->ProjectDirs_).CurrentBinary,true);
              local_5a2 = bVar5 ^ 0xff;
            }
          }
        }
      }
      if (bVar3) {
        std::__cxx11::string::~string((string *)&local_518);
      }
      if (bVar2) {
        std::allocator<char>::~allocator(&local_519);
      }
      if ((local_4f3 & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_4f0);
      }
      if ((local_4f2 & 1) != 0) {
        std::allocator<char>::~allocator(&local_4f1);
      }
      if ((local_4cb & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_4c8);
      }
      if ((local_4ca & 1) != 0) {
        std::allocator<char>::~allocator(&local_4c9);
      }
      if ((local_4a3 & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_4a0);
      }
      if ((local_4a2 & 1) != 0) {
        std::allocator<char>::~allocator(&local_4a1);
      }
      std::__cxx11::string::~string((string *)&local_478);
      std::allocator<char>::~allocator(&local_479);
      if ((local_5a2 & 1) == 0) {
        Logger::RaiseVerbosity(&this->Logger_,local_454);
        uVar7 = (*this->_vptr_cmQtAutoGenerator[2])(this,local_180);
        if ((uVar7 & 1) == 0) {
          infoFile_local._M_str._7_1_ = 0;
          local_3ec = 1;
        }
        else {
          local_3ec = 0;
        }
      }
      else {
        infoFile_local._M_str._7_1_ = 0;
        local_3ec = 1;
      }
    }
    InfoT::~InfoT((InfoT *)local_180);
    if (local_3ec == 0) {
      iVar8 = (*this->_vptr_cmQtAutoGenerator[3])();
      infoFile_local._M_str._7_1_ = (byte)iVar8 & 1;
    }
  }
  else {
    auVar12 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&this->InfoFile_);
    text._M_len = auVar12._8_8_;
    info.Gen_ = auVar12._0_8_;
    text._M_str = (char *)pcVar11;
    cmQtAutoGen::Quoted_abi_cxx11_(&local_140,(cmQtAutoGen *)info.Gen_,text);
    cmStrCat<char_const(&)[24],std::__cxx11::string,char_const(&)[18]>
              (&local_120,(char (*) [24])"AutoGen: The info file ",&local_140,
               (char (*) [18])" is not readable\n");
    cmSystemTools::Stderr(&local_120);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_140);
    infoFile_local._M_str._7_1_ = 0;
  }
  return (bool)(infoFile_local._M_str._7_1_ & 1);
}

Assistant:

bool cmQtAutoGenerator::Run(cm::string_view infoFile, cm::string_view config,
                            cm::string_view executableConfig)
{
  // Info config
  this->InfoConfig_ = std::string(config);
  this->ExecutableConfig_ = std::string(executableConfig);

  // Info file
  this->InfoFile_ = std::string(infoFile);
  cmSystemTools::CollapseFullPath(this->InfoFile_);
  this->InfoDir_ = cmSystemTools::GetFilenamePath(this->InfoFile_);

  // Load info file time
  if (!this->InfoFileTime_.Load(this->InfoFile_)) {
    cmSystemTools::Stderr(cmStrCat("AutoGen: The info file ",
                                   Quoted(this->InfoFile_),
                                   " is not readable\n"));
    return false;
  }

  {
    InfoT info(*this);

    // Read info file
    {
      cmsys::ifstream ifs(this->InfoFile_.c_str(),
                          (std::ios::in | std::ios::binary));
      if (!ifs) {
        this->Log().Error(
          this->GenType_,
          cmStrCat("Could not to open info file ", Quoted(this->InfoFile_)));
        return false;
      }
      if (!info.Read(ifs)) {
        this->Log().Error(
          this->GenType_,
          cmStrCat("Could not read info file ", Quoted(this->InfoFile_)));
        return false;
      }
    }

    // -- Read common info settings
    {
      unsigned int verbosity = 0;
      // Info: setup project directories
      if (!info.GetUInt("VERBOSITY", verbosity, false) ||
          !info.GetString("CMAKE_SOURCE_DIR", this->ProjectDirs_.Source,
                          true) ||
          !info.GetString("CMAKE_BINARY_DIR", this->ProjectDirs_.Binary,
                          true) ||
          !info.GetString("CMAKE_CURRENT_SOURCE_DIR",
                          this->ProjectDirs_.CurrentSource, true) ||
          !info.GetString("CMAKE_CURRENT_BINARY_DIR",
                          this->ProjectDirs_.CurrentBinary, true)) {
        return false;
      }
      this->Logger_.RaiseVerbosity(verbosity);
    }

    // -- Call virtual init from info method.
    if (!this->InitFromInfo(info)) {
      return false;
    }
  }

  // Call virtual process method.
  return this->Process();
}